

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdevice.cpp
# Opt level: O2

void QInputDevicePrivate::registerDevice(QInputDevice *dev)

{
  Type *this;
  QLoggingCategory *pQVar1;
  QDebug *pQVar2;
  QBasicMutex *this_00;
  long in_FS_OFFSET;
  QDebug local_50;
  Stream *local_48;
  undefined1 local_40 [8];
  undefined1 local_38 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = &devicesMutex;
  local_38._0_8_ = &devicesMutex;
  QBasicMutex::lock(&devicesMutex);
  local_38[8] = true;
  this = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_deviceList>_>::operator()
                   ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_deviceList>_>
                     *)this_00);
  QList<const_QInputDevice_*>::append(this,dev);
  pQVar1 = QtPrivateLogging::lcQpaInputDevices();
  if (((pQVar1->field_2).bools.enabledInfo._q_value._M_base._M_i & 1U) != 0) {
    QMessageLogger::info();
    pQVar2 = QDebug::operator<<(&local_50,"Registered");
    local_48 = pQVar2->stream;
    local_48->ref = local_48->ref + 1;
    ::operator<<((Stream *)local_40,(QInputDevice *)&local_48);
    QDebug::~QDebug((QDebug *)local_40);
    QDebug::~QDebug((QDebug *)&local_48);
    QDebug::~QDebug(&local_50);
  }
  QMutexLocker<QBasicMutex>::~QMutexLocker((QMutexLocker<QBasicMutex> *)local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QInputDevicePrivate::registerDevice(const QInputDevice *dev)
{
    QMutexLocker lock(&devicesMutex);
    deviceList()->append(dev);
    qCInfo(lcQpaInputDevices) << "Registered" << dev;
}